

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O0

void __thiscall
ut::registry::add_test<agge::joins::tests::BevelJoinTests>
          (registry *this,offset_in_BevelJoinTests_to_subr method,char *name)

{
  test_case_impl<agge::joins::tests::BevelJoinTests> *ptVar1;
  char *pcVar2;
  char *in_RCX;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  value_type local_140;
  _Base_ptr local_130;
  undefined1 local_128;
  immutable_basic_string<char> local_120;
  allocator local_109;
  immutable_basic_string<char> local_108;
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [39];
  undefined1 local_b1;
  offset_in_BevelJoinTests_to_subr local_b0;
  char *local_a8;
  shared_ptr<ut::setup_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int> local_a0;
  allocator local_89;
  shared_ptr<ut::setup_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int> local_88 [3];
  undefined1 local_58 [8];
  shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int> tc;
  shared_ptr<ut::setup_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int> setup;
  char *name_local;
  offset_in_BevelJoinTests_to_subr method_local;
  registry *this_local;
  
  get_setup<agge::joins::tests::BevelJoinTests>((registry *)&tc._refcount);
  ptVar1 = (test_case_impl<agge::joins::tests::BevelJoinTests> *)operator_new(0x38);
  local_b1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_88,in_RCX,&local_89);
  shared_ptr<ut::setup_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int>::shared_ptr
            (&local_a0,
             (shared_ptr<ut::setup_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int> *)
             &tc._refcount);
  local_b0 = method;
  local_a8 = name;
  test_case_impl<agge::joins::tests::BevelJoinTests>::test_case_impl
            (ptVar1,method,(string *)name,local_88);
  local_b1 = 0;
  shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int>::shared_ptr
            ((shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int> *)
             local_58,ptVar1);
  shared_ptr<ut::setup_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int>::~shared_ptr
            (&local_a0);
  std::__cxx11::string::~string((string *)local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  ptVar1 = shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int>::
           operator->((shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int>
                       *)local_58);
  (*(ptVar1->super_test_case).super_destructible._vptr_destructible[2])(&local_108);
  pcVar2 = exportable::immutable_basic_string<char>::c_str(&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,pcVar2,&local_109);
  ptVar1 = shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int>::
           operator->((shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int>
                       *)local_58);
  (*(ptVar1->super_test_case).super_destructible._vptr_destructible[3])(&local_120);
  exportable::immutable_basic_string<char>::c_str(&local_120);
  std::operator+(local_d8,(char *)local_f8);
  pVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->_registered_names,local_d8);
  local_130 = (_Base_ptr)pVar3.first._M_node;
  local_128 = pVar3.second;
  std::__cxx11::string::~string((string *)local_d8);
  exportable::immutable_basic_string<char>::~immutable_basic_string(&local_120);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  exportable::immutable_basic_string<char>::~immutable_basic_string(&local_108);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    shared_ptr<ut::test_case,unsigned_int>::
    shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>>
              ((shared_ptr<ut::test_case,unsigned_int> *)&local_140,
               (shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int> *)
               local_58);
    std::
    vector<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
    ::push_back(&this->_test_cases,&local_140);
    shared_ptr<ut::test_case,_unsigned_int>::~shared_ptr(&local_140);
  }
  shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int>::~shared_ptr
            ((shared_ptr<ut::test_case_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int> *)
             local_58);
  shared_ptr<ut::setup_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int>::~shared_ptr
            ((shared_ptr<ut::setup_impl<agge::joins::tests::BevelJoinTests>,_unsigned_int> *)
             &tc._refcount);
  return;
}

Assistant:

inline void registry::add_test(void (FixtureT::*method)(), const char *name)
	{
		typedef test_case_impl<FixtureT> test_case;
		typedef setup_impl<FixtureT> fixture_setup;

		shared_ptr<fixture_setup> setup(get_setup<FixtureT>());
		shared_ptr<test_case> tc(new test_case_impl<FixtureT>(method, name, setup));

		if (_registered_names.insert(std::string(tc->fixture_name().c_str()) + tc->name().c_str()).second)
			_test_cases.push_back(tc);
	}